

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

int Cbs0_ManSolve_rec(Cbs0_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  int local_34;
  int local_30;
  int iJustTail;
  int iJustHead;
  int iPropHead;
  Gia_Obj_t *pDecVar;
  Gia_Obj_t *pVar;
  Cbs0_Man_t *p_local;
  
  pDecVar = (Gia_Obj_t *)0x0;
  pVar = (Gia_Obj_t *)p;
  iVar2 = Cbs0_QueIsEmpty(&p->pProp);
  if (iVar2 != 0) {
    __assert_fail("!Cbs0_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x24f,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
  }
  iVar2 = Cbs0_ManPropagate((Cbs0_Man_t *)pVar);
  if (iVar2 == 0) {
    iVar2 = Cbs0_QueIsEmpty((Cbs0_Que_t *)(pVar + 4));
    if (iVar2 == 0) {
      __assert_fail("Cbs0_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                    ,0x253,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
    }
    iVar2 = Cbs0_QueIsEmpty((Cbs0_Que_t *)(pVar + 6));
    if (iVar2 == 0) {
      iVar2 = Abc_MaxInt(*(int *)(pVar + 1),*(int *)&pVar[6].field_0x4 - *(int *)(pVar + 6));
      *(int *)(pVar + 1) = iVar2;
      iVar2 = Cbs0_ManCheckLimits((Cbs0_Man_t *)pVar);
      if (iVar2 == 0) {
        iJustTail = *(int *)(pVar + 4);
        Cbs0_QueStore((Cbs0_Que_t *)(pVar + 6),&local_30,&local_34);
        if (*(int *)(pVar + 2) == 0) {
          if (*(int *)&pVar[2].field_0x4 == 0) {
            if (pVar[2].Value == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                            ,0x264,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
            }
            pDecVar = Cbs0_ManDecideMaxFF((Cbs0_Man_t *)pVar);
          }
          else {
            pDecVar = Cbs0_ManDecideLowest((Cbs0_Man_t *)pVar);
          }
        }
        else {
          pDecVar = Cbs0_ManDecideHighest((Cbs0_Man_t *)pVar);
        }
        iVar2 = Cbs0_VarIsJust(pDecVar);
        if (iVar2 == 0) {
          __assert_fail("Cbs0_VarIsJust( pVar )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                        ,0x265,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
        }
        pGVar1 = *(Gia_Man_t **)&pVar[3].field_0x4;
        pGVar4 = Gia_ObjFanin0(pDecVar);
        iVar2 = Gia_ObjRefNum(pGVar1,pGVar4);
        pGVar1 = *(Gia_Man_t **)&pVar[3].field_0x4;
        pGVar4 = Gia_ObjFanin1(pDecVar);
        iVar3 = Gia_ObjRefNum(pGVar1,pGVar4);
        if (iVar3 < iVar2) {
          pGVar4 = Gia_ObjChild0(pDecVar);
          _iJustHead = Gia_Not(pGVar4);
        }
        else {
          pGVar4 = Gia_ObjChild1(pDecVar);
          _iJustHead = Gia_Not(pGVar4);
        }
        Cbs0_ManAssign((Cbs0_Man_t *)pVar,_iJustHead);
        iVar2 = Cbs0_ManSolve_rec((Cbs0_Man_t *)pVar);
        if (iVar2 == 0) {
          p_local._4_4_ = 0;
        }
        else {
          Cbs0_ManCancelUntil((Cbs0_Man_t *)pVar,iJustTail);
          Cbs0_QueRestore((Cbs0_Que_t *)(pVar + 6),local_30,local_34);
          pGVar4 = pVar;
          pObj = Gia_Not(_iJustHead);
          Cbs0_ManAssign((Cbs0_Man_t *)pGVar4,pObj);
          iVar2 = Cbs0_ManSolve_rec((Cbs0_Man_t *)pVar);
          if (iVar2 == 0) {
            p_local._4_4_ = 0;
          }
          else {
            pVar->Value = pVar->Value + 1;
            p_local._4_4_ = 1;
          }
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Cbs0_ManSolve_rec( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_ManPropagate( p ) )
        return 1;
    // check for satisfying assignment
    assert( Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs0_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs0_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs0_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs0_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs0_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs0_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
    // decide on first fanin
    Cbs0_ManAssign( p, pDecVar );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    Cbs0_ManCancelUntil( p, iPropHead );
    Cbs0_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs0_ManAssign( p, Gia_Not(pDecVar) );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    p->Pars.nBTThis++;
    return 1;
}